

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesOverclockGetVFPointValues
          (zes_overclock_handle_t hDomainHandle,zes_vf_type_t VFType,zes_vf_array_type_t VFArrayType
          ,uint32_t PointIndex,uint32_t *PointValue)

{
  zes_pfnOverclockGetVFPointValues_t pfnGetVFPointValues;
  ze_result_t result;
  uint32_t *PointValue_local;
  uint32_t PointIndex_local;
  zes_vf_array_type_t VFArrayType_local;
  zes_vf_type_t VFType_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  pfnGetVFPointValues._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb68 != (code *)0x0) {
    pfnGetVFPointValues._4_4_ =
         (*DAT_0011cb68)(hDomainHandle,VFType,VFArrayType,PointIndex,PointValue);
  }
  return pfnGetVFPointValues._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetVFPointValues(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_vf_type_t VFType,                           ///< [in] Voltage or Freqency point to read.
        zes_vf_array_type_t VFArrayType,                ///< [in] User,Default or Live VF array to read from
        uint32_t PointIndex,                            ///< [in] Point index - number between (0, max_num_points - 1).
        uint32_t* PointValue                            ///< [out] Returns the frequency in 1kHz units or voltage in millivolt
                                                        ///< units from the custom V-F curve at the specified zero-based index 
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetVFPointValues = context.zesDdiTable.Overclock.pfnGetVFPointValues;
        if( nullptr != pfnGetVFPointValues )
        {
            result = pfnGetVFPointValues( hDomainHandle, VFType, VFArrayType, PointIndex, PointValue );
        }
        else
        {
            // generic implementation
        }

        return result;
    }